

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  size_t printer_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppFVar6;
  reference ppFVar7;
  FieldOptions *this_01;
  FieldGenerator *pFVar8;
  char *pcVar9;
  reference pvVar10;
  LogMessage *pLVar11;
  value_type this_02;
  string *psVar12;
  anon_class_8_1_8991fb9c *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_01;
  Iterator IVar13;
  Iterator IVar14;
  Hex hex;
  Hex hex_00;
  bool local_459;
  string local_440;
  string local_420;
  value_type local_400;
  value_type field_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4_1;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  LogMessage local_388;
  undefined1 local_350 [12];
  AlphaNum local_340;
  undefined1 local_310 [8];
  string mask;
  int has_bit_index;
  string local_2b0;
  LogFinisher local_28a;
  byte local_289;
  LogMessage local_288;
  allocator local_249;
  string local_248;
  byte local_221;
  FieldGenerator *pFStack_220;
  bool have_enclosing_if;
  FieldGenerator *generator;
  FieldDescriptor *field;
  const_iterator __end4;
  const_iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  undefined1 local_1f0 [5];
  bool deferred_has_bit_changes;
  LogFinisher local_1b2;
  byte local_1b1;
  LogMessage local_1b0;
  undefined1 local_178 [12];
  AlphaNum local_168;
  undefined1 local_138 [8];
  string chunk_mask_str;
  uint32_t chunk_mask;
  bool local_e9;
  reference pvStack_e8;
  bool have_outer_if;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *chunk;
  int chunk_index;
  int cached_has_word_index;
  ColdChunkSkipper cold_skipper;
  undefined1 local_78 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  AlphaNum *a_00;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "void $classname$::MergeFrom(const $classname$& from) {\n$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
              );
    Formatter::Indent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,"$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n");
    cold_skipper._80_8_ = this;
    (anonymous_namespace)::
    CollectFields<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom(google::protobuf::io::Printer*)::__0>
              ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)local_78,(_anonymous_namespace_ *)&this->optimized_order_,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&cold_skipper.limit_chunk_,in_RCX);
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              ((ColdChunkSkipper *)&chunk_index,&this->options_,
               (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)local_78,&this->has_bit_indices_,0.005);
    chunk._4_4_ = -1;
    for (chunk._0_4_ = 0; uVar4 = (ulong)(int)chunk,
        sVar5 = std::
                vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ::size((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        *)local_78), uVar4 < sVar5; chunk._0_4_ = (int)chunk + 1) {
      pvStack_e8 = std::
                   vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                   ::operator[]((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                 *)local_78,(long)(int)chunk);
      sVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(pvStack_e8);
      local_459 = false;
      if (1 < sVar5) {
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::front(pvStack_e8);
        iVar2 = HasByteIndex(this,*ppFVar6);
        local_459 = iVar2 != -1;
      }
      iVar3 = chunk._4_4_;
      iVar2 = (int)chunk;
      local_e9 = local_459;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&chunk_mask,"from.",
                 (allocator *)(chunk_mask_str.field_2._M_local_buf + 0xf));
      anon_unknown_0::ColdChunkSkipper::OnStartChunk
                ((ColdChunkSkipper *)&chunk_index,iVar2,iVar3,(string *)&chunk_mask,
                 (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&chunk_mask);
      std::allocator<char>::~allocator
                ((allocator<char> *)(chunk_mask_str.field_2._M_local_buf + 0xf));
      if ((local_e9 & 1U) != 0) {
        chunk_mask_str.field_2._8_4_ =
             anon_unknown_0::GenChunkMask(pvStack_e8,&this->has_bit_indices_);
        strings::Hex::Hex<unsigned_int>((Hex *)local_178,chunk_mask_str.field_2._8_4_,ZERO_PAD_8);
        hex._12_4_ = 0;
        hex.value = local_178._0_8_;
        hex.spec = local_178._8_4_;
        strings::AlphaNum::AlphaNum(&local_168,hex);
        StrCat_abi_cxx11_((string *)local_138,(protobuf *)&local_168,a);
        local_1b1 = 0;
        iVar2 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
        if (iVar2 < 2) {
          internal::LogMessage::LogMessage
                    (&local_1b0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xe21);
          local_1b1 = 1;
          pLVar11 = internal::LogMessage::operator<<
                              (&local_1b0,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=(&local_1b2,pLVar11);
        }
        if ((local_1b1 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_1b0);
        }
        __range4._7_1_ = 0;
        iVar2 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
        if (8 < iVar2) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xe22);
          __range4._7_1_ = 1;
          pLVar11 = internal::LogMessage::operator<<
                              ((LogMessage *)local_1f0,"CHECK failed: (8) >= (popcnt(chunk_mask)): "
                              );
          internal::LogFinisher::operator=((LogFinisher *)((long)&__range4 + 6),pLVar11);
        }
        if ((__range4._7_1_ & 1) != 0) {
          internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
        }
        iVar2 = chunk._4_4_;
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::front(pvStack_e8);
        iVar3 = HasWordIndex(this,*ppFVar6);
        if (iVar2 != iVar3) {
          ppFVar6 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::front(pvStack_e8);
          chunk._4_4_ = HasWordIndex(this,*ppFVar6);
          Formatter::operator()
                    ((Formatter *)local_50,"cached_has_bits = from._has_bits_[$1$];\n",
                     (int *)((long)&chunk + 4));
        }
        Formatter::operator()
                  ((Formatter *)local_50,"if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
        Formatter::Indent((Formatter *)local_50);
        std::__cxx11::string::~string((string *)local_138);
      }
      this_00 = pvStack_e8;
      __range4._5_1_ = 0;
      __end4 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin(pvStack_e8);
      field = (FieldDescriptor *)
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                         *)&field), bVar1) {
        ppFVar7 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&__end4);
        generator = (FieldGenerator *)*ppFVar7;
        pFStack_220 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)generator);
        bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)generator);
        if (bVar1) {
          (*pFStack_220->_vptr_FieldGenerator[0xc])
                    (pFStack_220,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else {
          bVar1 = FieldDescriptor::is_optional((FieldDescriptor *)generator);
          if ((!bVar1) ||
             (bVar1 = HasHasbit((FieldDescriptor *)generator),
             printer_00 = format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count, bVar1)) {
            this_01 = FieldDescriptor::options((FieldDescriptor *)generator);
            bVar1 = FieldOptions::weak(this_01);
            iVar2 = chunk._4_4_;
            if ((bVar1) ||
               (pFVar8 = generator, iVar3 = HasWordIndex(this,(FieldDescriptor *)generator),
               iVar2 != iVar3)) {
              local_289 = 0;
              bVar1 = HasHasbit((FieldDescriptor *)generator);
              field_00 = extraout_RDX;
              if (!bVar1) {
                internal::LogMessage::LogMessage
                          (&local_288,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xe42);
                local_289 = 1;
                pLVar11 = internal::LogMessage::operator<<
                                    (&local_288,"CHECK failed: HasHasbit(field): ");
                internal::LogFinisher::operator=(&local_28a,pLVar11);
                field_00 = extraout_RDX_00;
              }
              if ((local_289 & 1) != 0) {
                internal::LogMessage::~LogMessage(&local_288);
                field_00 = extraout_RDX_01;
              }
              FieldName_abi_cxx11_(&local_2b0,(cpp *)generator,field_00);
              Formatter::operator()
                        ((Formatter *)local_50,"if (from._internal_has_$1$()) {\n",&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
              Formatter::Indent((Formatter *)local_50);
              (*pFStack_220->_vptr_FieldGenerator[0xc])
                        (pFStack_220,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
              Formatter::Outdent((Formatter *)local_50);
              Formatter::operator()<>((Formatter *)local_50,"}\n");
            }
            else {
              mask.field_2._M_local_buf[0xf] = '\0';
              bVar1 = HasHasbit((FieldDescriptor *)generator);
              iVar2 = extraout_EDX;
              if (!bVar1) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)&has_bit_index,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xe4a);
                mask.field_2._M_local_buf[0xf] = '\x01';
                pFVar8 = (FieldGenerator *)
                         internal::LogMessage::operator<<
                                   ((LogMessage *)&has_bit_index,"CHECK failed: HasHasbit(field): ")
                ;
                internal::LogFinisher::operator=
                          ((LogFinisher *)(mask.field_2._M_local_buf + 0xe),(LogMessage *)pFVar8);
                iVar2 = extraout_EDX_00;
              }
              if ((mask.field_2._M_local_buf[0xf] & 1U) != 0) {
                internal::LogMessage::~LogMessage((LogMessage *)&has_bit_index);
                iVar2 = extraout_EDX_01;
              }
              pcVar9 = FieldDescriptor::index((FieldDescriptor *)generator,(char *)pFVar8,iVar2);
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&this->has_bit_indices_,(long)(int)pcVar9);
              mask.field_2._8_4_ = *pvVar10;
              strings::Hex::Hex<unsigned_int>
                        ((Hex *)local_350,1 << ((byte)mask.field_2._8_4_ & 0x1f),ZERO_PAD_8);
              hex_00._12_4_ = 0;
              hex_00.value = local_350._0_8_;
              hex_00.spec = local_350._8_4_;
              strings::AlphaNum::AlphaNum(&local_340,hex_00);
              StrCat_abi_cxx11_((string *)local_310,(protobuf *)&local_340,a_00);
              Formatter::operator()
                        ((Formatter *)local_50,"if (cached_has_bits & 0x$1$u) {\n",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_310);
              Formatter::Indent((Formatter *)local_50);
              if (((local_e9 & 1U) == 0) ||
                 (bVar1 = anon_unknown_0::IsPOD((FieldDescriptor *)generator), !bVar1)) {
                (*pFStack_220->_vptr_FieldGenerator[0xc])
                          (pFStack_220,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                          );
              }
              else {
                __range4._5_1_ = 1;
                (*pFStack_220->_vptr_FieldGenerator[0xd])
                          (pFStack_220,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                          );
              }
              Formatter::Outdent((Formatter *)local_50);
              Formatter::operator()<>((Formatter *)local_50,"}\n");
              std::__cxx11::string::~string((string *)local_310);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_248,"from.",&local_249);
            bVar1 = anon_unknown_0::EmitFieldNonDefaultCondition
                              ((Printer *)printer_00,&local_248,(FieldDescriptor *)generator);
            std::__cxx11::string::~string((string *)&local_248);
            std::allocator<char>::~allocator((allocator<char> *)&local_249);
            local_221 = bVar1;
            (*pFStack_220->_vptr_FieldGenerator[0xc])
                      (pFStack_220,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if ((local_221 & 1) != 0) {
              Formatter::Outdent((Formatter *)local_50);
              Formatter::operator()<>((Formatter *)local_50,"}\n");
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end4);
      }
      if ((local_e9 & 1U) != 0) {
        if ((__range4._5_1_ & 1) != 0) {
          __range3._7_1_ = 0;
          if (chunk._4_4_ < 0) {
            internal::LogMessage::LogMessage
                      (&local_388,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xe62);
            __range3._7_1_ = 1;
            pLVar11 = internal::LogMessage::operator<<
                                (&local_388,"CHECK failed: (0) <= (cached_has_word_index): ");
            internal::LogFinisher::operator=((LogFinisher *)((long)&__range3 + 6),pLVar11);
          }
          if ((__range3._7_1_ & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_388);
          }
          Formatter::operator()
                    ((Formatter *)local_50,"_has_bits_[$1$] |= cached_has_bits;\n",
                     (int *)((long)&chunk + 4));
        }
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"}\n");
      }
      bVar1 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)&chunk_index,(int)chunk,
                         (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        chunk._4_4_ = -1;
      }
    }
    __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar13 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
    __begin3._0_8_ = IVar13.descriptor;
    __end3.descriptor._0_4_ = IVar13.idx;
    IVar13 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
    __end3._0_8_ = IVar13.descriptor;
    oneof._0_4_ = IVar13.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof), bVar1) {
      this_02 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
      psVar12 = OneofDescriptor::name_abi_cxx11_(this_02);
      Formatter::operator()((Formatter *)local_50,"switch (from.$1$_case()) {\n",psVar12);
      Formatter::Indent((Formatter *)local_50);
      __begin4_1.descriptor =
           (OneofDescriptor *)FieldRange<google::protobuf::OneofDescriptor>(this_02);
      IVar14 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                         ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                          &__begin4_1.descriptor);
      __begin4_1._0_8_ = IVar14.descriptor;
      __end4_1.descriptor._0_4_ = IVar14.idx;
      IVar14 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                         ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                          &__begin4_1.descriptor);
      __end4_1._0_8_ = IVar14.descriptor;
      field_1._0_4_ = IVar14.idx;
      while (bVar1 = cpp::operator!=((Iterator *)&__end4_1.descriptor,(Iterator *)&field_1), bVar1)
      {
        local_400 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                              ((Iterator *)&__end4_1.descriptor);
        psVar12 = FieldDescriptor::name_abi_cxx11_(local_400);
        UnderscoresToCamelCase(&local_420,psVar12,true);
        Formatter::operator()((Formatter *)local_50,"case k$1$: {\n",&local_420);
        std::__cxx11::string::~string((string *)&local_420);
        Formatter::Indent((Formatter *)local_50);
        bVar1 = IsFieldStripped(local_400,&this->options_);
        if (!bVar1) {
          pFVar8 = FieldGeneratorMap::get(&this->field_generators_,local_400);
          (*pFVar8->_vptr_FieldGenerator[0xc])
                    (pFVar8,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        Formatter::operator()<>((Formatter *)local_50,"break;\n");
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"}\n");
        FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                  ((Iterator *)&__end4_1.descriptor);
      }
      psVar12 = OneofDescriptor::name_abi_cxx11_(this_02);
      ToUpper(&local_440,psVar12);
      Formatter::operator()((Formatter *)local_50,"case $1$_NOT_SET: {\n  break;\n}\n",&local_440);
      std::__cxx11::string::~string((string *)&local_440);
      Formatter::Outdent((Formatter *)local_50);
      Formatter::operator()<>((Formatter *)local_50,"}\n");
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>
                ((Formatter *)local_50,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
    }
    iVar2 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar2) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_50,
               "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n");
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"}\n");
    anon_unknown_0::ColdChunkSkipper::~ColdChunkSkipper((ColdChunkSkipper *)&chunk_index);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)local_78);
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    format(
        "_extensions_.MergeFrom(internal_default_instance(), "
        "from._extensions_);\n");
  }

  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}